

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall lzham::symbol_codec::put_bits_init(symbol_codec *this,uint expected_size)

{
  bool bVar1;
  
  this->m_bit_buf = 0;
  this->m_bit_count = 0x40;
  vector<unsigned_char>::try_resize(&this->m_output_buf,0,false);
  bVar1 = vector<unsigned_char>::try_reserve(&this->m_output_buf,expected_size);
  return bVar1;
}

Assistant:

bool symbol_codec::put_bits_init(uint expected_size)
   {
      m_bit_buf = 0;
      m_bit_count = cBitBufSize;

      m_output_buf.try_resize(0);
      if (!m_output_buf.try_reserve(expected_size))
         return false;

      return true;
   }